

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_fuzz.c
# Opt level: O2

int fuzzCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,void *userData)

{
  ulong uVar1;
  float fVar2;
  
  if (inputBuffer == (void *)0x0) {
    for (uVar1 = 0; (uVar1 & 0xffffffff) < framesPerBuffer; uVar1 = uVar1 + 1) {
      *(undefined8 *)((long)outputBuffer + uVar1 * 8) = 0;
    }
    gNumNoInputs = gNumNoInputs + 1;
  }
  else {
    for (uVar1 = 0; (uVar1 & 0xffffffff) < framesPerBuffer; uVar1 = uVar1 + 1) {
      fVar2 = CubicAmplifier(*(float *)((long)inputBuffer + uVar1 * 8));
      fVar2 = CubicAmplifier(fVar2);
      fVar2 = CubicAmplifier(fVar2);
      fVar2 = CubicAmplifier(fVar2);
      *(float *)((long)outputBuffer + uVar1 * 8) = fVar2;
      *(undefined4 *)((long)outputBuffer + uVar1 * 8 + 4) =
           *(undefined4 *)((long)inputBuffer + uVar1 * 8 + 4);
    }
  }
  return 0;
}

Assistant:

static int fuzzCallback( const void *inputBuffer, void *outputBuffer,
                         unsigned long framesPerBuffer,
                         const PaStreamCallbackTimeInfo* timeInfo,
                         PaStreamCallbackFlags statusFlags,
                         void *userData )
{
    SAMPLE *out = (SAMPLE*)outputBuffer;
    const SAMPLE *in = (const SAMPLE*)inputBuffer;
    unsigned int i;
    (void) timeInfo; /* Prevent unused variable warnings. */
    (void) statusFlags;
    (void) userData;

    if( inputBuffer == NULL )
    {
        for( i=0; i<framesPerBuffer; i++ )
        {
            *out++ = 0;  /* left - silent */
            *out++ = 0;  /* right - silent */
        }
        gNumNoInputs += 1;
    }
    else
    {
        for( i=0; i<framesPerBuffer; i++ )
        {
            *out++ = FUZZ(*in++);  /* left - distorted */
            *out++ = *in++;          /* right - clean */
        }
    }
    
    return paContinue;
}